

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::pos(buffer *this,size_t p)

{
  size_t sVar1;
  ulong in_RSI;
  buffer *in_RDI;
  size_t position;
  size_t local_30;
  
  sVar1 = size(in_RDI);
  local_30 = in_RSI;
  if (sVar1 < in_RSI) {
    local_30 = size(in_RDI);
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = (short)local_30;
  }
  else {
    *(int *)(in_RDI + 4) = (int)local_30;
  }
  return;
}

Assistant:

void buffer::pos(size_t p) {
    size_t position = ( p > size() ) ? size() : p;
    __set_block_pos(this, position);
}